

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_sa46_on_net(lws_sockaddr46 *sa46a,lws_sockaddr46 *sa46_net,int net_len)

{
  in_addr *local_48;
  uint8_t *p2;
  uint8_t *p1;
  uint8_t norm [16];
  uint8_t mask;
  int net_len_local;
  lws_sockaddr46 *sa46_net_local;
  lws_sockaddr46 *sa46a_local;
  
  norm[0xb] = 0xff;
  if ((sa46a->sa4).sin_family == 2) {
    p2 = (uint8_t *)&(sa46a->sa4).sin_addr;
    norm._12_4_ = net_len;
    if ((sa46_net->sa4).sin_family == 10) {
      lws_4to6((uint8_t *)&p1,p2);
      p2 = (uint8_t *)&p1;
    }
    if ((sa46_net->sa4).sin_family == 2) {
      local_48 = &(sa46_net->sa4).sin_addr;
      if ((sa46a->sa4).sin_family == 10) {
        lws_4to6((uint8_t *)&p1,(uint8_t *)local_48);
        local_48 = (in_addr *)&p1;
        norm._12_4_ = norm._12_4_ + 0x60;
      }
      for (; 0 < (int)norm._12_4_; norm._12_4_ = norm._12_4_ + -8) {
        if ((int)norm._12_4_ < 8) {
          norm[0xb] = norm[0xb] << (8 - (uint8_t)norm._12_4_ & 0x1f);
        }
        if ((*p2 & norm[0xb]) != ((byte)local_48->s_addr & norm[0xb])) {
          return 1;
        }
        local_48 = (in_addr *)((long)&local_48->s_addr + 1);
        p2 = p2 + 1;
      }
      sa46a_local._4_4_ = 0;
    }
    else {
      sa46a_local._4_4_ = 1;
    }
  }
  else {
    sa46a_local._4_4_ = 1;
  }
  return sa46a_local._4_4_;
}

Assistant:

int
lws_sa46_on_net(const lws_sockaddr46 *sa46a, const lws_sockaddr46 *sa46_net,
		int net_len)
{
	uint8_t mask = 0xff, norm[16];
	const uint8_t *p1, *p2;

	if (sa46a->sa4.sin_family == AF_INET) {
		p1 = (uint8_t *)&sa46a->sa4.sin_addr;
		if (sa46_net->sa4.sin_family == AF_INET6) {
			/* ip is v4, net is v6, promote ip to v6 */

			lws_4to6(norm, p1);
			p1 = norm;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p1 = (uint8_t *)&sa46a->sa6.sin6_addr;
#endif
		} else
			return 1;

	if (sa46_net->sa4.sin_family == AF_INET) {
		p2 = (uint8_t *)&sa46_net->sa4.sin_addr;
		if (sa46a->sa4.sin_family == AF_INET6) {
			/* ip is v6, net is v4, promote net to v6 */

			lws_4to6(norm, p2);
			p2 = norm;
			/* because the mask length is for net v4 address */
			net_len += 12 * 8;
		}
#if defined(LWS_WITH_IPV6)
	} else
		if (sa46a->sa4.sin_family == AF_INET6) {
			p2 = (uint8_t *)&sa46_net->sa6.sin6_addr;
#endif
		} else
			return 1;

	while (net_len > 0) {
		if (net_len < 8)
			mask = (uint8_t)(mask << (8 - net_len));

		if (((*p1++) & mask) != ((*p2++) & mask))
			return 1;

		net_len -= 8;
	}

	return 0;
}